

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O3

void printdef(char *name,char *suf,int type,uint64_t val,char *file)

{
  FILE *__stream;
  char *__format;
  int len;
  int local_2c;
  
  __stream = (FILE *)findfout(file);
  if (suf == (char *)0x0) {
    fprintf(__stream,"#define %s%n",name,&local_2c);
  }
  else {
    fprintf(__stream,"#define %s__%s%n",name,suf,&local_2c);
  }
  if (val >> 0x20 == 0 || type != 0) {
    seekcol((FILE *)__stream,local_2c,startcol);
    if (type == 1) {
      __format = "%lu\n";
    }
    else {
      if (type != 0) {
        return;
      }
      __format = "0x%08lx\n";
      if (val >> 0x20 != 0) {
        __format = "0x%016lxULL\n";
      }
    }
  }
  else {
    seekcol((FILE *)__stream,local_2c,startcol + -8);
    __format = "0x%016lxULL\n";
  }
  fprintf(__stream,__format,val);
  return;
}

Assistant:

void printdef (char *name, char *suf, int type, uint64_t val, char *file) {
	FILE *dst = findfout(file);
	int len;
	if (suf)
		fprintf (dst, "#define %s__%s%n", name, suf, &len);
	else
		fprintf (dst, "#define %s%n", name, &len);
	if (type == 0 && val > 0xffffffffull)
		seekcol (dst, len, startcol-8);
	else
		seekcol (dst, len, startcol);
	switch (type) {
		case 0:
			if (val > 0xffffffffull)
				fprintf (dst, "0x%016"PRIx64"ULL\n", val);
			else
				fprintf (dst, "0x%08"PRIx64"\n", val);
			break;
		case 1:
			fprintf (dst, "%"PRIu64"\n", val);
			break;
	}
}